

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

TapBranchDataStruct * __thiscall
cfd::js::api::json::TapBranchData::ConvertToStruct
          (TapBranchDataStruct *__return_storage_ptr__,TapBranchData *this)

{
  TapBranchData *this_local;
  TapBranchDataStruct *result;
  
  TapBranchDataStruct::TapBranchDataStruct(__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&this->tapscript_);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->branch_hash,(string *)&this->branch_hash_);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->tree_string,(string *)&this->tree_string_);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&__return_storage_ptr__->ignore_items,&this->ignore_items);
  return __return_storage_ptr__;
}

Assistant:

TapBranchDataStruct TapBranchData::ConvertToStruct() const {  // NOLINT
  TapBranchDataStruct result;
  result.tapscript = tapscript_;
  result.branch_hash = branch_hash_;
  result.tree_string = tree_string_;
  result.ignore_items = ignore_items;
  return result;
}